

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t driver::zeDeviceGetStatus(ze_device_handle_t hDevice)

{
  ze_result_t zVar1;
  
  if (DAT_0010d248 != (code *)0x0) {
    zVar1 = (*DAT_0010d248)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetStatus(
        ze_device_handle_t hDevice                      ///< [in] handle of the device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetStatus = context.zeDdiTable.Device.pfnGetStatus;
        if( nullptr != pfnGetStatus )
        {
            result = pfnGetStatus( hDevice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }